

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database_unittest.cc
# Opt level: O0

void google::protobuf::anon_unknown_0::ExpectContainsType
               (FileDescriptorProto *proto,string *type_name)

{
  int iVar1;
  __type _Var2;
  int iVar3;
  DescriptorProto *this;
  string *psVar4;
  Message *pMVar5;
  AssertHelper local_40 [3];
  Message local_28;
  int local_1c;
  string *psStack_18;
  int i;
  string *type_name_local;
  FileDescriptorProto *proto_local;
  
  local_1c = 0;
  psStack_18 = type_name;
  type_name_local = (string *)proto;
  while( true ) {
    iVar1 = local_1c;
    iVar3 = FileDescriptorProto::message_type_size((FileDescriptorProto *)type_name_local);
    if (iVar3 <= iVar1) {
      testing::Message::Message(&local_28);
      pMVar5 = testing::Message::operator<<(&local_28,(char (*) [2])0x1fa3044);
      psVar4 = FileDescriptorProto::name_abi_cxx11_((FileDescriptorProto *)type_name_local);
      pMVar5 = testing::Message::operator<<(pMVar5,psVar4);
      pMVar5 = testing::Message::operator<<
                         (pMVar5,(char (*) [34])"\" did not contain expected type \"");
      pMVar5 = testing::Message::operator<<(pMVar5,psStack_18);
      pMVar5 = testing::Message::operator<<(pMVar5,(char (*) [3])0x2073f9d);
      testing::internal::AssertHelper::AssertHelper
                (local_40,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
                 ,0x2b,"Failed");
      testing::internal::AssertHelper::operator=(local_40,pMVar5);
      testing::internal::AssertHelper::~AssertHelper(local_40);
      testing::Message::~Message(&local_28);
      return;
    }
    this = FileDescriptorProto::message_type((FileDescriptorProto *)type_name_local,local_1c);
    psVar4 = DescriptorProto::name_abi_cxx11_(this);
    _Var2 = std::operator==(psVar4,psStack_18);
    if (_Var2) break;
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

static void ExpectContainsType(const FileDescriptorProto& proto,
                               const std::string& type_name) {
  for (int i = 0; i < proto.message_type_size(); i++) {
    if (proto.message_type(i).name() == type_name) return;
  }
  ADD_FAILURE() << "\"" << proto.name() << "\" did not contain expected type \""
                << type_name << "\".";
}